

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  int32_t hiddenSize;
  int32_t outputSize;
  int iVar1;
  double __x;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  Predictions predictions;
  State state;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined1 local_d8 [16];
  pointer local_c8;
  undefined1 local_b8 [16];
  pointer local_a8;
  Meter *local_98;
  State local_90;
  
  local_f8._0_12_ = ZEXT812(0);
  local_f8._12_4_ = 0;
  local_c8 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  hiddenSize = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->dim;
  local_d8 = local_f8;
  local_b8 = local_f8;
  local_98 = meter;
  outputSize = Dictionary::nlabels((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
  Model::State::State(&local_90,hiddenSize,outputSize,0);
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg((long)in,_S_beg);
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    if (local_d8._8_8_ != local_d8._0_8_) {
      local_d8._8_8_ = local_d8._0_8_;
    }
    if (local_f8._8_8_ != local_f8._0_8_) {
      local_f8._8_8_ = local_f8._0_8_;
    }
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)local_d8,
                        (vector<int,_std::allocator<int>_> *)local_f8);
    if ((local_f8._0_8_ != local_f8._8_8_) && (local_d8._0_8_ != local_d8._8_8_)) {
      if (local_b8._8_8_ != local_b8._0_8_) {
        local_b8._8_8_ = local_b8._0_8_;
      }
      __x = (double)(ulong)(uint)threshold;
      predict(this,k,(vector<int,_std::allocator<int>_> *)local_d8,(Predictions *)local_b8,threshold
             );
      Meter::log(local_98,__x);
    }
  }
  Model::State::~State(&local_90);
  std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_d8);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
    const {
  std::vector<int32_t> line;
  std::vector<int32_t> labels;
  Predictions predictions;
  Model::State state(args_->dim, dict_->nlabels(), 0);
  in.clear();
  in.seekg(0, std::ios_base::beg);

  while (in.peek() != EOF) {
    line.clear();
    labels.clear();
    dict_->getLine(in, line, labels);

    if (!labels.empty() && !line.empty()) {
      predictions.clear();
      predict(k, line, predictions, threshold);
      meter.log(labels, predictions);
    }
  }
}